

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache-aliasing.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> __s;
  long lVar5;
  bool bVar6;
  unique_ptr<int[],_std::default_delete<int[]>_> memory;
  vector<int_*,_std::allocator<int_*>_> data;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (argc < 3) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: cache-aliasing <count> <increment>");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar1 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&data,argv[1],(allocator *)&memory);
    iVar1 = std::__cxx11::stoi((string *)&data,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&data);
    std::__cxx11::string::string((string *)&data,argv[2],(allocator *)&memory);
    iVar2 = std::__cxx11::stoi((string *)&data,(size_t *)0x0,10);
    lVar5 = (long)iVar1;
    std::__cxx11::string::~string((string *)&data);
    uVar4 = iVar2 * lVar5;
    uVar4 = -(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4;
    __s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)operator_new__(uVar4);
    memset((void *)__s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl,0,uVar4);
    data.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    data.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    data.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    memory._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   __s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      local_38._M_head_impl =
           (int *)__s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
      std::vector<int*,std::allocator<int*>>::emplace_back<int*>
                ((vector<int*,std::allocator<int*>> *)&data,&local_38._M_head_impl);
      __s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           ((long)__s._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + (long)iVar2);
    }
    test_memory(&data);
    std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
              (&data.super__Vector_base<int_*,_std::allocator<int_*>_>);
    std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&memory);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 3)
    {
        std::cout << "Usage: cache-aliasing <count> <increment>" << std::endl;
        return 1;
    }

    size_t count = static_cast<size_t>(std::stoi(argv[1]));
    size_t increment = static_cast<size_t>(std::stoi(argv[2]));

    auto memory = std::unique_ptr<int[]>(new int[count * increment]());
    auto startAddress = reinterpret_cast<size_t>(memory.get());

    std::vector<int*> data;

    for (size_t i = 0; i < count; i++)
    {
        data.push_back((int*)(startAddress + i * increment));
    }

    test_memory(data);

    return 0;
}